

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

unsigned_long
NonAdaptingProcess(PaUtilBufferProcessor *bp,int *streamCallbackResult,
                  PaUtilChannelDescriptor *hostInputChannels,
                  PaUtilChannelDescriptor *hostOutputChannels,unsigned_long framesToProcess)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  unsigned_long local_90;
  int skipInputConvert;
  int skipOutputConvert;
  unsigned_long framesProcessed;
  unsigned_long framesToGo;
  unsigned_long frameCount;
  uint local_60;
  uint i;
  uint destChannelStrideBytes;
  uint destSampleStrideSamples;
  uint srcChannelStrideBytes;
  uint srcSampleStrideSamples;
  uchar *destBytePtr;
  uchar *srcBytePtr;
  void *userOutput;
  void *userInput;
  unsigned_long framesToProcess_local;
  PaUtilChannelDescriptor *hostOutputChannels_local;
  PaUtilChannelDescriptor *hostInputChannels_local;
  int *streamCallbackResult_local;
  PaUtilBufferProcessor *bp_local;
  undefined4 uVar8;
  
  _skipInputConvert = 0;
  bVar3 = false;
  bVar2 = false;
  framesProcessed = framesToProcess;
  if (*streamCallbackResult == 0) {
    do {
      if (bp->framesPerTempBuffer < framesProcessed) {
        local_90 = bp->framesPerTempBuffer;
      }
      else {
        local_90 = framesProcessed;
      }
      uVar1 = (uint)local_90;
      if (bp->inputChannelCount == 0) {
        userOutput = (void *)0x0;
      }
      else {
        _srcChannelStrideBytes = bp->tempInputBuffer;
        if (bp->userInputIsInterleaved == 0) {
          i = 1;
          local_60 = uVar1 * bp->bytesPerUserInputSample;
          if (((bp->userInputSampleFormatIsEqualToHost == 0) || (bp->hostInputIsInterleaved != 0))
             || (bp->hostInputChannels[0]->data == (void *)0x0)) {
            for (frameCount._4_4_ = 0; frameCount._4_4_ < bp->inputChannelCount;
                frameCount._4_4_ = frameCount._4_4_ + 1) {
              bp->tempInputBufferPtrs[frameCount._4_4_] =
                   (void *)((long)bp->tempInputBuffer +
                           (frameCount._4_4_ * bp->bytesPerUserInputSample) * local_90);
            }
          }
          else {
            for (frameCount._4_4_ = 0; frameCount._4_4_ < bp->inputChannelCount;
                frameCount._4_4_ = frameCount._4_4_ + 1) {
              bp->tempInputBufferPtrs[frameCount._4_4_] = hostInputChannels[frameCount._4_4_].data;
            }
            bVar2 = true;
          }
          userOutput = bp->tempInputBufferPtrs;
        }
        else {
          i = bp->inputChannelCount;
          local_60 = bp->bytesPerUserInputSample;
          if (((bp->userInputSampleFormatIsEqualToHost == 0) || (bp->hostInputIsInterleaved == 0))
             || ((bp->hostInputChannels[0]->data == (void *)0x0 ||
                 (bp->inputChannelCount != hostInputChannels->stride)))) {
            userOutput = bp->tempInputBuffer;
          }
          else {
            userOutput = hostInputChannels->data;
            _srcChannelStrideBytes = hostInputChannels->data;
            bVar2 = true;
          }
        }
        if (bp->hostInputChannels[0]->data == (void *)0x0) {
          for (frameCount._4_4_ = 0; frameCount._4_4_ < bp->inputChannelCount;
              frameCount._4_4_ = frameCount._4_4_ + 1) {
            (*bp->inputZeroer)(_srcChannelStrideBytes,i,uVar1);
            _srcChannelStrideBytes = (void *)((long)_srcChannelStrideBytes + (ulong)local_60);
          }
        }
        else if (bVar2) {
          for (frameCount._4_4_ = 0; frameCount._4_4_ < bp->inputChannelCount;
              frameCount._4_4_ = frameCount._4_4_ + 1) {
            hostInputChannels[frameCount._4_4_].data =
                 (void *)((long)hostInputChannels[frameCount._4_4_].data +
                         local_90 * hostInputChannels[frameCount._4_4_].stride *
                         (ulong)bp->bytesPerHostInputSample);
          }
        }
        else {
          for (frameCount._4_4_ = 0; frameCount._4_4_ < bp->inputChannelCount;
              frameCount._4_4_ = frameCount._4_4_ + 1) {
            (*bp->inputConverter)
                      (_srcChannelStrideBytes,i,hostInputChannels[frameCount._4_4_].data,
                       hostInputChannels[frameCount._4_4_].stride,uVar1,&bp->ditherGenerator);
            _srcChannelStrideBytes = (void *)((long)_srcChannelStrideBytes + (ulong)local_60);
            hostInputChannels[frameCount._4_4_].data =
                 (void *)((long)hostInputChannels[frameCount._4_4_].data +
                         local_90 * hostInputChannels[frameCount._4_4_].stride *
                         (ulong)bp->bytesPerHostInputSample);
          }
        }
      }
      if (bp->outputChannelCount == 0) {
        srcBytePtr = (uchar *)0x0;
      }
      else if (bp->userOutputIsInterleaved == 0) {
        if ((bp->userOutputSampleFormatIsEqualToHost == 0) || (bp->hostOutputIsInterleaved != 0)) {
          for (frameCount._4_4_ = 0; frameCount._4_4_ < bp->outputChannelCount;
              frameCount._4_4_ = frameCount._4_4_ + 1) {
            bp->tempOutputBufferPtrs[frameCount._4_4_] =
                 (void *)((long)bp->tempOutputBuffer +
                         (frameCount._4_4_ * bp->bytesPerUserOutputSample) * local_90);
          }
        }
        else {
          for (frameCount._4_4_ = 0; frameCount._4_4_ < bp->outputChannelCount;
              frameCount._4_4_ = frameCount._4_4_ + 1) {
            bp->tempOutputBufferPtrs[frameCount._4_4_] = hostOutputChannels[frameCount._4_4_].data;
          }
          bVar3 = true;
        }
        srcBytePtr = (uchar *)bp->tempOutputBufferPtrs;
      }
      else if (((bp->userOutputSampleFormatIsEqualToHost == 0) || (bp->hostOutputIsInterleaved == 0)
               ) || (bp->outputChannelCount != hostOutputChannels->stride)) {
        srcBytePtr = (uchar *)bp->tempOutputBuffer;
      }
      else {
        srcBytePtr = (uchar *)hostOutputChannels->data;
        bVar3 = true;
      }
      iVar4 = (*bp->streamCallback)
                        (userOutput,srcBytePtr,local_90,bp->timeInfo,bp->callbackStatusFlags,
                         bp->userData);
      *streamCallbackResult = iVar4;
      if (*streamCallbackResult != 2) {
        uVar8 = (undefined4)(local_90 >> 0x20);
        auVar6._8_4_ = uVar8;
        auVar6._0_8_ = local_90;
        auVar6._12_4_ = 0x45300000;
        bp->timeInfo->inputBufferAdcTime =
             ((auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * bp->samplePeriod +
             bp->timeInfo->inputBufferAdcTime;
        auVar7._8_4_ = uVar8;
        auVar7._0_8_ = local_90;
        auVar7._12_4_ = 0x45300000;
        bp->timeInfo->outputBufferDacTime =
             ((auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * bp->samplePeriod +
             bp->timeInfo->outputBufferDacTime;
        if ((bp->outputChannelCount != 0) && (bp->hostOutputChannels[0]->data != (void *)0x0)) {
          if (bVar3) {
            for (frameCount._4_4_ = 0; frameCount._4_4_ < bp->outputChannelCount;
                frameCount._4_4_ = frameCount._4_4_ + 1) {
              hostOutputChannels[frameCount._4_4_].data =
                   (void *)((long)hostOutputChannels[frameCount._4_4_].data +
                           local_90 * hostOutputChannels[frameCount._4_4_].stride *
                           (ulong)bp->bytesPerHostOutputSample);
            }
          }
          else {
            destBytePtr = (uchar *)bp->tempOutputBuffer;
            if (bp->userOutputIsInterleaved == 0) {
              destSampleStrideSamples = 1;
              destChannelStrideBytes = uVar1 * bp->bytesPerUserOutputSample;
            }
            else {
              destSampleStrideSamples = bp->outputChannelCount;
              destChannelStrideBytes = bp->bytesPerUserOutputSample;
            }
            for (frameCount._4_4_ = 0; frameCount._4_4_ < bp->outputChannelCount;
                frameCount._4_4_ = frameCount._4_4_ + 1) {
              (*bp->outputConverter)
                        (hostOutputChannels[frameCount._4_4_].data,
                         hostOutputChannels[frameCount._4_4_].stride,destBytePtr,
                         destSampleStrideSamples,uVar1,&bp->ditherGenerator);
              destBytePtr = destBytePtr + destChannelStrideBytes;
              hostOutputChannels[frameCount._4_4_].data =
                   (void *)((long)hostOutputChannels[frameCount._4_4_].data +
                           local_90 * hostOutputChannels[frameCount._4_4_].stride *
                           (ulong)bp->bytesPerHostOutputSample);
            }
          }
        }
        _skipInputConvert = local_90 + _skipInputConvert;
        framesProcessed = framesProcessed - local_90;
      }
      bVar5 = false;
      if (framesProcessed != 0) {
        bVar5 = *streamCallbackResult == 0;
      }
    } while (bVar5);
  }
  if (framesProcessed != 0) {
    if ((bp->outputChannelCount != 0) && (bp->hostOutputChannels[0]->data != (void *)0x0)) {
      for (frameCount._4_4_ = 0; frameCount._4_4_ < bp->outputChannelCount;
          frameCount._4_4_ = frameCount._4_4_ + 1) {
        (*bp->outputZeroer)(hostOutputChannels[frameCount._4_4_].data,
                            hostOutputChannels[frameCount._4_4_].stride,(uint)framesProcessed);
        hostOutputChannels[frameCount._4_4_].data =
             (void *)((long)hostOutputChannels[frameCount._4_4_].data +
                     framesProcessed * hostOutputChannels[frameCount._4_4_].stride *
                     (ulong)bp->bytesPerHostOutputSample);
      }
    }
    _skipInputConvert = framesProcessed + _skipInputConvert;
  }
  return _skipInputConvert;
}

Assistant:

static unsigned long NonAdaptingProcess( PaUtilBufferProcessor *bp,
        int *streamCallbackResult,
        PaUtilChannelDescriptor *hostInputChannels,
        PaUtilChannelDescriptor *hostOutputChannels,
        unsigned long framesToProcess )
{
    void *userInput, *userOutput;
    unsigned char *srcBytePtr, *destBytePtr;
    unsigned int srcSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int srcChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int destSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int destChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i;
    unsigned long frameCount;
    unsigned long framesToGo = framesToProcess;
    unsigned long framesProcessed = 0;
    int skipOutputConvert = 0;
    int skipInputConvert = 0;


    if( *streamCallbackResult == paContinue )
    {
        do
        {
            frameCount = PA_MIN_( bp->framesPerTempBuffer, framesToGo );

            /* configure user input buffer and convert input data (host -> user) */
            if( bp->inputChannelCount == 0 )
            {
                /* no input */
                userInput = 0;
            }
            else /* there are input channels */
            {
                
                destBytePtr = (unsigned char *)bp->tempInputBuffer;

                if( bp->userInputIsInterleaved )
                {
                    destSampleStrideSamples = bp->inputChannelCount;
                    destChannelStrideBytes = bp->bytesPerUserInputSample;

                    /* process host buffer directly, or use temp buffer if formats differ or host buffer non-interleaved,
                     * or if num channels differs between the host (set in stride) and the user (eg with some Alsa hw:) */
                    if( bp->userInputSampleFormatIsEqualToHost && bp->hostInputIsInterleaved
                        && bp->hostInputChannels[0][0].data && bp->inputChannelCount == hostInputChannels[0].stride )
                    {
                        userInput = hostInputChannels[0].data;
                        destBytePtr = (unsigned char *)hostInputChannels[0].data;
                        skipInputConvert = 1;
                    }
                    else
                    {
                        userInput = bp->tempInputBuffer;
                    }
                }
                else /* user input is not interleaved */
                {
                    destSampleStrideSamples = 1;
                    destChannelStrideBytes = frameCount * bp->bytesPerUserInputSample;

                    /* setup non-interleaved ptrs */
                    if( bp->userInputSampleFormatIsEqualToHost && !bp->hostInputIsInterleaved && bp->hostInputChannels[0][0].data )
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                            bp->tempInputBufferPtrs[i] = hostInputChannels[i].data;
                        }
                        skipInputConvert = 1;
                    }
                    else
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                            bp->tempInputBufferPtrs[i] = ((unsigned char*)bp->tempInputBuffer) +
                                i * bp->bytesPerUserInputSample * frameCount;
                        }
                    }
                
                    userInput = bp->tempInputBufferPtrs;
                }

                if( !bp->hostInputChannels[0][0].data )
                {
                    /* no input was supplied (see PaUtil_SetNoInput), so
                        zero the input buffer */

                    for( i=0; i<bp->inputChannelCount; ++i )
                    {
                        bp->inputZeroer( destBytePtr, destSampleStrideSamples, frameCount );
                        destBytePtr += destChannelStrideBytes;  /* skip to next destination channel */
                    }
                }
                else
	            {
                    if( skipInputConvert )
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                            /* advance src ptr for next iteration */
                            hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                                    frameCount * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
                        }
                    }
                    else
                    {
                        for( i=0; i<bp->inputChannelCount; ++i )
                        {
                            bp->inputConverter( destBytePtr, destSampleStrideSamples,
                                                    hostInputChannels[i].data,
                                                    hostInputChannels[i].stride,
                                                    frameCount, &bp->ditherGenerator );

                            destBytePtr += destChannelStrideBytes;  /* skip to next destination channel */

                            /* advance src ptr for next iteration */
                            hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                                    frameCount * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
                        }
                    }
                }
            }

            /* configure user output buffer */
            if( bp->outputChannelCount == 0 )
            {
                /* no output */
                userOutput = 0;
            }
            else /* there are output channels */
            {
                if( bp->userOutputIsInterleaved )
                {
                    /* process host buffer directly, or use temp buffer if formats differ or host buffer non-interleaved,
                     * or if num channels differs between the host (set in stride) and the user (eg with some Alsa hw:) */
                    if( bp->userOutputSampleFormatIsEqualToHost && bp->hostOutputIsInterleaved
                          && bp->outputChannelCount == hostOutputChannels[0].stride )
                    {
                        userOutput = hostOutputChannels[0].data;
                        skipOutputConvert = 1;
                    }
                    else
                    {
                        userOutput = bp->tempOutputBuffer;
                    }
                }
                else /* user output is not interleaved */
                {
                    if( bp->userOutputSampleFormatIsEqualToHost && !bp->hostOutputIsInterleaved )
                    {
                        for( i=0; i<bp->outputChannelCount; ++i )
                        {
                            bp->tempOutputBufferPtrs[i] = hostOutputChannels[i].data;
                        }
                        skipOutputConvert = 1;
                    }
                    else
                    {
                        for( i=0; i<bp->outputChannelCount; ++i )
                        {
                            bp->tempOutputBufferPtrs[i] = ((unsigned char*)bp->tempOutputBuffer) +
                                i * bp->bytesPerUserOutputSample * frameCount;
                        }
                    }

                    userOutput = bp->tempOutputBufferPtrs;
                }
            }
        
            *streamCallbackResult = bp->streamCallback( userInput, userOutput,
                    frameCount, bp->timeInfo, bp->callbackStatusFlags, bp->userData );

            if( *streamCallbackResult == paAbort )
            {
                /* callback returned paAbort, don't advance framesProcessed
                        and framesToGo, they will be handled below */
            }
            else
            {
                bp->timeInfo->inputBufferAdcTime += frameCount * bp->samplePeriod;
                bp->timeInfo->outputBufferDacTime += frameCount * bp->samplePeriod;

                /* convert output data (user -> host) */
                
                if( bp->outputChannelCount != 0 && bp->hostOutputChannels[0][0].data )
                {
                    if( skipOutputConvert )
					{
						for( i=0; i<bp->outputChannelCount; ++i )
                    	{
                        	/* advance dest ptr for next iteration */
                        	hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                            	    frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
                    	}
					}
					else
					{

                    	srcBytePtr = (unsigned char *)bp->tempOutputBuffer;

                    	if( bp->userOutputIsInterleaved )
                    	{
                        	srcSampleStrideSamples = bp->outputChannelCount;
                        	srcChannelStrideBytes = bp->bytesPerUserOutputSample;
                    	}
                    	else /* user output is not interleaved */
                    	{
                        	srcSampleStrideSamples = 1;
                        	srcChannelStrideBytes = frameCount * bp->bytesPerUserOutputSample;
                    	}

                    	for( i=0; i<bp->outputChannelCount; ++i )
                    	{
                        	bp->outputConverter(    hostOutputChannels[i].data,
                                                	hostOutputChannels[i].stride,
                                                	srcBytePtr, srcSampleStrideSamples,
                                                	frameCount, &bp->ditherGenerator );

                        	srcBytePtr += srcChannelStrideBytes;  /* skip to next source channel */

                        	/* advance dest ptr for next iteration */
                        	hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                                		frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
                    	}
					}
                }
             
                framesProcessed += frameCount;

                framesToGo -= frameCount;
            }
        }
        while( framesToGo > 0  && *streamCallbackResult == paContinue );
    }

    if( framesToGo > 0 )
    {
        /* zero any remaining frames output. There will only be remaining frames
            if the callback has returned paComplete or paAbort */

        frameCount = framesToGo;

        if( bp->outputChannelCount != 0 && bp->hostOutputChannels[0][0].data )
        {
            for( i=0; i<bp->outputChannelCount; ++i )
            {
                bp->outputZeroer(   hostOutputChannels[i].data,
                                    hostOutputChannels[i].stride,
                                    frameCount );

                /* advance dest ptr for next iteration */
                hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                        frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
            }
        }

        framesProcessed += frameCount;
    }

    return framesProcessed;
}